

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall TPZSkylMatrix<double>::Subst_Diag(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  double **ppdVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  double *pdVar4;
  long lVar5;
  int iVar6;
  long col;
  int extraout_var_00;
  
  lVar3 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar6 = 0;
  if ((lVar3 == CONCAT44(extraout_var,iVar2)) &&
     ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed == '\x04')) {
    iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    lVar3 = CONCAT44(extraout_var_00,iVar2);
    iVar6 = 1;
    if (lVar3 != 0) {
      col = 0;
      if (lVar3 == 0 || extraout_var_00 < 0) {
        lVar3 = col;
      }
      for (; col < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol; col = col + 1) {
        pdVar4 = TPZFMatrix<double>::operator()(B,0,col);
        ppdVar1 = (this->fElem).fStore;
        for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
          pdVar4[lVar5] = pdVar4[lVar5] / *ppdVar1[lVar5];
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ELDLt) return( 0 );
    int64_t dimension = this->Dim();
    if (!dimension) {
        return 1;
    }
    for ( int64_t j = 0; j < B->Cols(); j++ ) {
        TVar *BPtr = &(*B)(0,j);
        int64_t k=0;
        while(k < dimension) *BPtr++ /= *(fElem[k++]);
    }
    return( 1 );
}